

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_internal_wrap.cpp
# Opt level: O0

hrgls_Status hrgls_DataBlobSourceSetStreamingState(hrgls_DataBlobSource stream,bool running)

{
  bool running_local;
  hrgls_DataBlobSource stream_local;
  
  if (stream == (hrgls_DataBlobSource)0x0) {
    stream_local._4_4_ = 0x3ee;
  }
  else {
    stream_local._4_4_ = hrgls::datablob::DataBlobSource::SetStreamingState(stream->stream,running);
  }
  return stream_local._4_4_;
}

Assistant:

hrgls_Status hrgls_DataBlobSourceSetStreamingState(hrgls_DataBlobSource stream,
    bool running)
  {
    if (!stream) {
      return hrgls_STATUS_NULL_OBJECT_POINTER;
    }
    try {
      return stream->stream->SetStreamingState(running);
    }
    catch (...) {
      return hrgls_STATUS_INTERNAL_EXCEPTION;
    }
  }